

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# name.h
# Opt level: O2

Name wasm::Name::fromInt(size_t i)

{
  size_t sVar1;
  Name NVar2;
  string local_38;
  
  std::__cxx11::to_string(&local_38,i);
  sVar1 = strlen(local_38._M_dataplus._M_p);
  NVar2.super_IString.str = (IString)wasm::IString::interned(sVar1,local_38._M_dataplus._M_p,0);
  std::__cxx11::string::~string((string *)&local_38);
  return (Name)NVar2.super_IString.str;
}

Assistant:

static Name fromInt(size_t i) {
    return IString(std::to_string(i).c_str(), false);
  }